

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<std::pair<QTableWidgetItem*,int>>::emplace<QTableWidgetItem*&,int&>
          (QPodArrayOps<std::pair<QTableWidgetItem*,int>> *this,qsizetype i,QTableWidgetItem **args,
          int *args_1)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  QTableWidgetItem *pQVar6;
  pair<QTableWidgetItem_*,_int> *ppVar7;
  GrowthPosition where;
  
  piVar2 = *(int **)this;
  if ((piVar2 != (int *)0x0) && (*piVar2 < 2)) {
    lVar3 = *(long *)(this + 0x10);
    if ((lVar3 == i) &&
       (lVar4 = *(long *)(this + 8),
       *(long *)(piVar2 + 2) !=
       ((long)(lVar4 - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 4) + i)) {
      *(QTableWidgetItem **)(lVar4 + i * 0x10) = *args;
      *(int *)(lVar4 + 8 + i * 0x10) = *args_1;
      *(qsizetype *)(this + 0x10) = i + 1;
      return;
    }
    if ((i == 0) &&
       (uVar5 = *(ulong *)(this + 8), ((long)piVar2 + 0x1fU & 0xfffffffffffffff0) != uVar5)) {
      *(QTableWidgetItem **)(uVar5 - 0x10) = *args;
      *(int *)(uVar5 - 8) = *args_1;
      *(ulong *)(this + 8) = uVar5 - 0x10;
      *(long *)(this + 0x10) = lVar3 + 1;
      return;
    }
  }
  pQVar6 = *args;
  iVar1 = *args_1;
  where = (GrowthPosition)(i == 0 && *(long *)(this + 0x10) != 0);
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *)this,where,1,
             (pair<QTableWidgetItem_*,_int> **)0x0,
             (QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *)0x0);
  ppVar7 = QPodArrayOps<std::pair<QTableWidgetItem_*,_int>_>::createHole
                     ((QPodArrayOps<std::pair<QTableWidgetItem_*,_int>_> *)this,where,i,1);
  ppVar7->first = pQVar6;
  ppVar7->second = iVar1;
  *(undefined4 *)&ppVar7->field_0xc = 0xaaaaaaaa;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }